

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffc2i(char *cval,long *ival,int *status)

{
  int iVar1;
  long lVar2;
  char dtype;
  double dval;
  int lval;
  char sval [81];
  char msg [81];
  byte local_e9;
  double local_e8;
  int local_dc;
  char local_d8 [96];
  char local_78 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (*cval == '\0') {
    *status = 0xcc;
    return 0xcc;
  }
  ffc2x(cval,(char *)&local_e9,ival,&local_dc,local_d8,&local_e8,status);
  if (local_e9 < 0x4c) {
    if (local_e9 == 0x43) {
      iVar1 = ffc2dd(local_d8,&local_e8,status);
      if (0 < iVar1) goto LAB_00187d14;
    }
    else if (local_e9 != 0x46) goto LAB_00187d14;
    if (9.223372036854776e+18 < ABS(local_e8)) {
      *status = 0x19c;
      goto LAB_00187d14;
    }
    lVar2 = (long)local_e8;
  }
  else {
    if (local_e9 != 0x4c) {
      if (local_e9 == 0x58) {
        *status = 0x193;
      }
      goto LAB_00187d14;
    }
    lVar2 = (long)local_dc;
  }
  *ival = lVar2;
LAB_00187d14:
  iVar1 = *status;
  if (0 < iVar1) {
    *ival = 0;
    builtin_strncpy(local_78 + 0x20," as an integer: ",0x11);
    builtin_strncpy(local_78 + 0x10,"valuating string",0x10);
    builtin_strncpy(local_78,"Error in ffc2i e",0x10);
    strncat(local_78,cval,0x1e);
    ffxmsg(5,local_78);
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffc2i(const char *cval,   /* I - string representation of the value */
          long *ival,         /* O - numerical value of the input string */
          int *status)        /* IO - error status */
/*
  convert formatted string to an integer value, doing implicit
  datatype conversion if necessary.
*/
{
    char dtype, sval[81], msg[81];
    int lval;
    double dval;
    
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == '\0')
        return(*status = VALUE_UNDEFINED);  /* null value string */
        
    /* convert the keyword to its native datatype */
    ffc2x(cval, &dtype, ival, &lval, sval, &dval, status);

    if (dtype == 'X' )
    {
            *status = BAD_INTKEY;
    }
    else if (dtype == 'C')
    {
            /* try reading the string as a number */
            if (ffc2dd(sval, &dval, status) <= 0)
            {
              if (dval > (double) LONG_MAX || dval < (double) LONG_MIN)
                *status = NUM_OVERFLOW;
              else
                *ival = (long) dval;
            }
    }
    else if (dtype == 'F')
    {
            if (dval > (double) LONG_MAX || dval < (double) LONG_MIN)
                *status = NUM_OVERFLOW;
            else
                *ival = (long) dval;
    }
    else if (dtype == 'L')
    {
            *ival = (long) lval;
    }

    if (*status > 0)
    {
            *ival = 0;
            strcpy(msg,"Error in ffc2i evaluating string as an integer: ");
            strncat(msg,cval,30);
            ffpmsg(msg);
            return(*status);
    }


    return(*status);
}